

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMask.cpp
# Opt level: O2

ChConstraintTwoBodies * __thiscall
chrono::ChLinkMask::GetActiveConstrByNum(ChLinkMask *this,int mnum)

{
  ChConstraintTwoBodies *pCVar1;
  int i;
  int iVar2;
  
  iVar2 = 0;
  i = 0;
  do {
    if (this->nconstr <= i) {
      return (ChConstraintTwoBodies *)0x0;
    }
    pCVar1 = Constr_N(this,i);
    if ((pCVar1->super_ChConstraintTwo).super_ChConstraint.active == true) {
      if (iVar2 == mnum) {
        pCVar1 = Constr_N(this,i);
        return pCVar1;
      }
      iVar2 = iVar2 + 1;
    }
    i = i + 1;
  } while( true );
}

Assistant:

ChConstraintTwoBodies* ChLinkMask::GetActiveConstrByNum(int mnum) {
    int cnt = 0;
    for (int i = 0; i < nconstr; i++) {
        if (Constr_N(i).IsActive()) {
            if (cnt == mnum)
                return &Constr_N(i);
            cnt++;
        }
    }
    return NULL;
}